

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CConstExpression *expression)

{
  uint __val;
  PrintVisitor *this_00;
  string local_70;
  string local_50;
  string local_30;
  
  this->lastVisited = this->lastVisited + 1;
  __val = CConstExpression::getValue(expression);
  this_00 = (PrintVisitor *)(ulong)__val;
  std::__cxx11::to_string(&local_50,__val);
  ConstructLabel(&local_30,this_00,&local_50,this->lastVisited);
  std::__cxx11::string::operator=((string *)&this->description,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  AddArrow(this,this->lastVisited);
  std::__cxx11::string::string((string *)&local_70,"Const",(allocator *)&local_30);
  AddLabel(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  this->lastVisited = this->lastVisited + 1;
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CConstExpression &expression ) {
    ++lastVisited;
    description = ConstructLabel( std::to_string( expression.getValue( )), lastVisited );
    AddArrow( lastVisited );
    AddLabel( "Const" );
    ++lastVisited;
}